

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

int __thiscall
icu_63::TimeArrayTimeZoneRule::clone
          (TimeArrayTimeZoneRule *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeArrayTimeZoneRule *this_00;
  undefined8 local_30;
  TimeArrayTimeZoneRule *this_local;
  
  this_00 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)__fn);
  local_30 = (TimeArrayTimeZoneRule *)0x0;
  if (this_00 != (TimeArrayTimeZoneRule *)0x0) {
    TimeArrayTimeZoneRule(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

TimeArrayTimeZoneRule*
TimeArrayTimeZoneRule::clone(void) const {
    return new TimeArrayTimeZoneRule(*this);
}